

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O0

Ptr __thiscall TgBot::TgTypeParser::parseJsonAndGetUpdate(TgTypeParser *this,ptree *data)

{
  int iVar1;
  element_type *peVar2;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr PVar3;
  allocator local_2e1;
  string local_2e0 [32];
  shared_ptr<TgBot::PreCheckoutQuery> local_2c0;
  code *local_2b0;
  undefined8 local_2a8;
  allocator local_299;
  string local_298 [32];
  shared_ptr<TgBot::ShippingQuery> local_278;
  code *local_268;
  undefined8 local_260;
  allocator local_251;
  string local_250 [32];
  shared_ptr<TgBot::CallbackQuery> local_230;
  code *local_220;
  undefined8 local_218;
  allocator local_209;
  string local_208 [32];
  shared_ptr<TgBot::ChosenInlineResult> local_1e8;
  code *local_1d8;
  undefined8 local_1d0;
  allocator local_1c1;
  string local_1c0 [32];
  shared_ptr<TgBot::InlineQuery> local_1a0;
  code *local_190;
  undefined8 local_188;
  allocator local_179;
  string local_178 [32];
  shared_ptr<TgBot::Message> local_158;
  code *local_148;
  undefined8 local_140;
  allocator local_131;
  string local_130 [32];
  shared_ptr<TgBot::Message> local_110;
  code *local_100;
  undefined8 local_f8;
  allocator local_e9;
  string local_e8 [32];
  shared_ptr<TgBot::Message> local_c8;
  code *local_b8;
  undefined8 local_b0;
  allocator local_a1;
  string local_a0 [32];
  shared_ptr<TgBot::Message> local_80 [2];
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  undefined1 local_21;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  ptree *data_local;
  TgTypeParser *this_local;
  shared_ptr<TgBot::Update> *result;
  
  local_21 = 0;
  local_20 = in_RDX;
  data_local = data;
  this_local = this;
  std::make_shared<TgBot::Update>();
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_58,"update_id",0x2e);
  iVar1 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<int>(local_20,&local_58);
  peVar2 = std::__shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar2->updateId = iVar1;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path(&local_58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"message",&local_a1);
  local_b8 = parseJsonAndGetMessage;
  local_b0 = 0;
  tryParseJson<TgBot::Message>
            ((TgTypeParser *)local_80,(JsonToTgTypeFunc<TgBot::Message>)data,
             (ptree *)parseJsonAndGetMessage,(string *)0x0);
  peVar2 = std::__shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<TgBot::Message>::operator=(&peVar2->message,local_80);
  std::shared_ptr<TgBot::Message>::~shared_ptr(local_80);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"edited_message",&local_e9);
  local_100 = parseJsonAndGetMessage;
  local_f8 = 0;
  tryParseJson<TgBot::Message>
            ((TgTypeParser *)&local_c8,(JsonToTgTypeFunc<TgBot::Message>)data,
             (ptree *)parseJsonAndGetMessage,(string *)0x0);
  peVar2 = std::__shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<TgBot::Message>::operator=(&peVar2->editedMessage,&local_c8);
  std::shared_ptr<TgBot::Message>::~shared_ptr(&local_c8);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"channel_post",&local_131);
  local_148 = parseJsonAndGetMessage;
  local_140 = 0;
  tryParseJson<TgBot::Message>
            ((TgTypeParser *)&local_110,(JsonToTgTypeFunc<TgBot::Message>)data,
             (ptree *)parseJsonAndGetMessage,(string *)0x0);
  peVar2 = std::__shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<TgBot::Message>::operator=(&peVar2->channelPost,&local_110);
  std::shared_ptr<TgBot::Message>::~shared_ptr(&local_110);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_178,"edited_channel_post",&local_179);
  local_190 = parseJsonAndGetMessage;
  local_188 = 0;
  tryParseJson<TgBot::Message>
            ((TgTypeParser *)&local_158,(JsonToTgTypeFunc<TgBot::Message>)data,
             (ptree *)parseJsonAndGetMessage,(string *)0x0);
  peVar2 = std::__shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<TgBot::Message>::operator=(&peVar2->editedChannelPost,&local_158);
  std::shared_ptr<TgBot::Message>::~shared_ptr(&local_158);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c0,"inline_query",&local_1c1);
  local_1d8 = parseJsonAndGetInlineQuery;
  local_1d0 = 0;
  tryParseJson<TgBot::InlineQuery>
            ((TgTypeParser *)&local_1a0,(JsonToTgTypeFunc<TgBot::InlineQuery>)data,
             (ptree *)parseJsonAndGetInlineQuery,(string *)0x0);
  peVar2 = std::__shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<TgBot::InlineQuery>::operator=(&peVar2->inlineQuery,&local_1a0);
  std::shared_ptr<TgBot::InlineQuery>::~shared_ptr(&local_1a0);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_208,"chosen_inline_result",&local_209);
  local_220 = parseJsonAndGetChosenInlineResult;
  local_218 = 0;
  tryParseJson<TgBot::ChosenInlineResult>
            ((TgTypeParser *)&local_1e8,(JsonToTgTypeFunc<TgBot::ChosenInlineResult>)data,
             (ptree *)parseJsonAndGetChosenInlineResult,(string *)0x0);
  peVar2 = std::__shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<TgBot::ChosenInlineResult>::operator=(&peVar2->chosenInlineResult,&local_1e8);
  std::shared_ptr<TgBot::ChosenInlineResult>::~shared_ptr(&local_1e8);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,"callback_query",&local_251);
  local_268 = parseJsonAndGetCallbackQuery;
  local_260 = 0;
  tryParseJson<TgBot::CallbackQuery>
            ((TgTypeParser *)&local_230,(JsonToTgTypeFunc<TgBot::CallbackQuery>)data,
             (ptree *)parseJsonAndGetCallbackQuery,(string *)0x0);
  peVar2 = std::__shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<TgBot::CallbackQuery>::operator=(&peVar2->callbackQuery,&local_230);
  std::shared_ptr<TgBot::CallbackQuery>::~shared_ptr(&local_230);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_298,"shipping_query",&local_299);
  local_2b0 = parseJsonAndGetShippingQuery;
  local_2a8 = 0;
  tryParseJson<TgBot::ShippingQuery>
            ((TgTypeParser *)&local_278,(JsonToTgTypeFunc<TgBot::ShippingQuery>)data,
             (ptree *)parseJsonAndGetShippingQuery,(string *)0x0);
  peVar2 = std::__shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<TgBot::ShippingQuery>::operator=(&peVar2->shippingQuery,&local_278);
  std::shared_ptr<TgBot::ShippingQuery>::~shared_ptr(&local_278);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e0,"pre_checkout_query",&local_2e1);
  tryParseJson<TgBot::PreCheckoutQuery>
            ((TgTypeParser *)&local_2c0,(JsonToTgTypeFunc<TgBot::PreCheckoutQuery>)data,
             (ptree *)parseJsonAndGetPreCheckoutQuery,(string *)0x0);
  peVar2 = std::__shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Update,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<TgBot::PreCheckoutQuery>::operator=(&peVar2->preCheckoutQuery,&local_2c0);
  std::shared_ptr<TgBot::PreCheckoutQuery>::~shared_ptr(&local_2c0);
  std::__cxx11::string::~string(local_2e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
  PVar3.super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar3.super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Ptr)PVar3.super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Update::Ptr TgTypeParser::parseJsonAndGetUpdate(const ptree& data) const {
    auto result(make_shared<Update>());
    result->updateId = data.get<int32_t>("update_id");
    result->message = tryParseJson<Message>(&TgTypeParser::parseJsonAndGetMessage, data, "message");
    result->editedMessage = tryParseJson<Message>(&TgTypeParser::parseJsonAndGetMessage, data, "edited_message");
    result->channelPost = tryParseJson<Message>(&TgTypeParser::parseJsonAndGetMessage, data, "channel_post");
    result->editedChannelPost = tryParseJson<Message>(&TgTypeParser::parseJsonAndGetMessage, data, "edited_channel_post");
    result->inlineQuery = tryParseJson<InlineQuery>(&TgTypeParser::parseJsonAndGetInlineQuery, data, "inline_query");
    result->chosenInlineResult = tryParseJson<ChosenInlineResult>(&TgTypeParser::parseJsonAndGetChosenInlineResult, data, "chosen_inline_result");
    result->callbackQuery = tryParseJson<CallbackQuery>(&TgTypeParser::parseJsonAndGetCallbackQuery, data, "callback_query");
    result->shippingQuery = tryParseJson<ShippingQuery>(&TgTypeParser::parseJsonAndGetShippingQuery, data, "shipping_query");
    result->preCheckoutQuery = tryParseJson<PreCheckoutQuery>(&TgTypeParser::parseJsonAndGetPreCheckoutQuery, data, "pre_checkout_query");
    return result;
}